

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

int data_pending(Curl_easy *data)

{
  _Bool local_21;
  connectdata *conn;
  Curl_easy *data_local;
  
  if ((data->conn->handler->protocol & 0xc) == 0) {
    local_21 = true;
    if ((data->conn->handler->protocol & 0x30) == 0) {
      local_21 = Curl_conn_data_pending(data,0);
    }
  }
  else {
    local_21 = Curl_conn_data_pending(data,1);
  }
  data_local._4_4_ = (uint)local_21;
  return data_local._4_4_;
}

Assistant:

static int data_pending(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;

  if(conn->handler->protocol&PROTO_FAMILY_FTP)
    return Curl_conn_data_pending(data, SECONDARYSOCKET);

  /* in the case of libssh2, we can never be really sure that we have emptied
     its internal buffers so we MUST always try until we get EAGAIN back */
  return conn->handler->protocol&(CURLPROTO_SCP|CURLPROTO_SFTP) ||
    Curl_conn_data_pending(data, FIRSTSOCKET);
}